

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::Server::set_base_dir(Server *this,char *dir,char *mount_point)

{
  bool bVar1;
  char *__s;
  string mnt;
  allocator<char> local_49;
  char *local_48;
  string local_40;
  
  local_48 = dir;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,dir,&local_49);
  bVar1 = detail::is_dir(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    __s = "/";
    if (mount_point != (char *)0x0) {
      __s = mount_point;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_49);
    if ((local_40._M_string_length != 0) && (*local_40._M_dataplus._M_p == '/')) {
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::__cxx11::string&,char_const*&>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&this->base_dirs_,&local_40,&local_48);
      std::__cxx11::string::~string((string *)&local_40);
      return true;
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  return false;
}

Assistant:

inline bool Server::set_base_dir(const char *dir, const char *mount_point) {
  if (detail::is_dir(dir)) {
    std::string mnt = mount_point ? mount_point : "/";
    if (!mnt.empty() && mnt[0] == '/') {
      base_dirs_.emplace_back(mnt, dir);
      return true;
    }
  }
  return false;
}